

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# render.cpp
# Opt level: O1

void __thiscall
CRenderTools::RenderTeeHand
          (CRenderTools *this,CTeeRenderInfo *pInfo,vec2 CenterPos,vec2 Dir,float AngleOffset,
          vec2 PostRotOffset)

{
  float fVar1;
  float fVar2;
  float fVar3;
  float fVar4;
  bool bVar5;
  long in_FS_OFFSET;
  float fVar6;
  anon_union_4_2_94730284_for_vector2_base<float>_1 __x;
  anon_union_4_2_94730284_for_vector2_base<float>_1 aVar7;
  anon_union_4_2_947302a4_for_vector2_base<float>_3 aVar8;
  anon_union_4_2_947302a4_for_vector2_base<float>_3 __y;
  CQuadItem QuadHand;
  anon_union_4_2_94730284_for_vector2_base<float>_1 local_58;
  anon_union_4_2_947302a4_for_vector2_base<float>_3 aStack_54;
  anon_union_4_2_94730284_for_vector2_base<float>_1 local_48;
  anon_union_4_2_947302a4_for_vector2_base<float>_3 aStack_44;
  float local_38;
  float fStack_34;
  float fStack_30;
  float fStack_2c;
  undefined8 local_28;
  float fStack_20;
  float fStack_1c;
  long local_18;
  
  __x = Dir.field_0;
  __y = Dir.field_1;
  local_18 = *(long *)(in_FS_OFFSET + 0x28);
  fVar1 = pInfo->m_Size;
  fVar6 = atan2f(__y.y,__x.x);
  aVar7.x = -__x.x;
  bVar5 = __x.x < aVar7.x;
  aVar8 = __y;
  if (aVar7.x <= __x.x) {
    aVar8.y = __y.y ^ 0x80000000;
    aVar7 = __x;
  }
  fStack_30 = fVar1 * 0.015625 * 15.0;
  fVar1 = pInfo->m_aColors[3].field_0.x;
  fVar2 = pInfo->m_aColors[3].field_1.y;
  fVar3 = pInfo->m_aColors[3].field_2.z;
  fVar4 = pInfo->m_aColors[3].field_3.w;
  fStack_30 = fStack_30 + fStack_30;
  local_58 = CenterPos.field_0;
  aStack_54 = CenterPos.field_1;
  local_48 = PostRotOffset.field_0;
  aStack_44 = PostRotOffset.field_1;
  local_38 = aStack_44.y * aVar8.y + local_48.x * __x.x + local_58.x + __x.x;
  fStack_34 = aStack_44.y * aVar7.x + local_48.x * __y.y + aStack_54.y + __y.y;
  local_28 = CONCAT44(fStack_34,local_38);
  fStack_2c = fStack_30;
  fStack_20 = fStack_30;
  fStack_1c = fStack_30;
  (*(this->m_pGraphics->super_IInterface)._vptr_IInterface[0x13])
            (this->m_pGraphics,(ulong)(uint)pInfo->m_aTextures[3].m_Id);
  (*(this->m_pGraphics->super_IInterface)._vptr_IInterface[0x17])();
  (*(this->m_pGraphics->super_IInterface)._vptr_IInterface[0x21])(fVar1,fVar2,fVar3,fVar4);
  (*(this->m_pGraphics->super_IInterface)._vptr_IInterface[0x19])
            ((float)(~-(uint)bVar5 & (uint)AngleOffset | (uint)-AngleOffset & -(uint)bVar5) + fVar6)
  ;
  if (0x4d < g_pData->m_NumSprites) {
    SelectSprite(this,g_pData->m_aSprites + 0x4d,0,0,0);
  }
  (*(this->m_pGraphics->super_IInterface)._vptr_IInterface[0x1c])(this->m_pGraphics,&local_28,1);
  if (0x4c < g_pData->m_NumSprites) {
    SelectSprite(this,g_pData->m_aSprites + 0x4c,0,0,0);
  }
  (*(this->m_pGraphics->super_IInterface)._vptr_IInterface[0x1c])(this->m_pGraphics,&local_38,1);
  (*(this->m_pGraphics->super_IInterface)._vptr_IInterface[0x19])(0);
  (*(this->m_pGraphics->super_IInterface)._vptr_IInterface[0x18])();
  if (*(long *)(in_FS_OFFSET + 0x28) != local_18) {
    __stack_chk_fail();
  }
  return;
}

Assistant:

void CRenderTools::RenderTeeHand(const CTeeRenderInfo *pInfo, vec2 CenterPos, vec2 Dir, float AngleOffset,
								 vec2 PostRotOffset)
{
	// in-game hand size is 15 when tee size is 64
	float BaseSize = 15.0f * (pInfo->m_Size / 64.0f);

	vec2 HandPos = CenterPos + Dir;
	float Angle = angle(Dir);
	if(Dir.x < 0)
		Angle -= AngleOffset;
	else
		Angle += AngleOffset;

	vec2 DirX = Dir;
	vec2 DirY(-Dir.y,Dir.x);

	if(Dir.x < 0)
		DirY = -DirY;

	HandPos += DirX * PostRotOffset.x;
	HandPos += DirY * PostRotOffset.y;

	const vec4 Color = pInfo->m_aColors[SKINPART_HANDS];
	IGraphics::CQuadItem QuadOutline(HandPos.x, HandPos.y, 2*BaseSize, 2*BaseSize);
	IGraphics::CQuadItem QuadHand = QuadOutline;

	Graphics()->TextureSet(pInfo->m_aTextures[SKINPART_HANDS]);
	Graphics()->QuadsBegin();
	Graphics()->SetColor(Color.r, Color.g, Color.b, Color.a);
	Graphics()->QuadsSetRotation(Angle);

	SelectSprite(SPRITE_TEE_HAND_OUTLINE, 0, 0, 0);
	Graphics()->QuadsDraw(&QuadOutline, 1);
	SelectSprite(SPRITE_TEE_HAND, 0, 0, 0);
	Graphics()->QuadsDraw(&QuadHand, 1);

	Graphics()->QuadsSetRotation(0);
	Graphics()->QuadsEnd();
}